

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O1

int Kit_TruthCountOnes_64bit(word *pIn,int nVars)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (0 < (int)uVar1) {
    lVar3 = (ulong)uVar1 + 1;
    iVar2 = 0;
    do {
      uVar4 = pIn[lVar3 + -2] - (pIn[lVar3 + -2] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f;
      uVar4 = (uVar4 >> 8) + uVar4;
      lVar5 = (uVar4 >> 0x10) + uVar4;
      iVar2 = iVar2 + ((int)((ulong)lVar5 >> 0x20) + (int)lVar5 & 0xffU);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
    return iVar2;
  }
  return 0;
}

Assistant:

int Kit_WordCountOnes_64bit(word x)
{
    x = x - ((x >> 1) & ABC_CONST(0x5555555555555555));   
    x = (x & ABC_CONST(0x3333333333333333)) + ((x >> 2) & ABC_CONST(0x3333333333333333));    
    x = (x + (x >> 4)) & ABC_CONST(0x0F0F0F0F0F0F0F0F);    
    x = x + (x >> 8);
    x = x + (x >> 16);
    x = x + (x >> 32); 
    return (int)(x & 0xFF);
}